

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter.c
# Opt level: O3

void interpret(Code c)

{
  char *pcVar1;
  clock_t cVar2;
  clock_t cVar3;
  Statement *pSVar4;
  ulong uVar5;
  Call call;
  undefined4 uStack_84;
  uint uStack_74;
  Object local_68;
  
  pSVar4 = c.parts;
  globalEnv = env_new((Environment *)0x0);
  register_native(globalEnv);
  if (0 < c.count) {
    uVar5 = c._0_8_ & 0xffffffff;
    do {
      executeStatement(&local_68,*pSVar4,globalEnv);
      pSVar4 = pSVar4 + 1;
      uVar5 = uVar5 - 1;
    } while (uVar5 != 0);
  }
  pcVar1 = strdup("Main");
  cVar2 = clock();
  resolveCall(&local_68,
              (Call)(ZEXT2032(CONCAT812((ulong)uStack_74 << 0x20,CONCAT84(pcVar1,uStack_84))) <<
                    0x20),globalEnv);
  cVar3 = clock();
  printf("\x1b[32m\n[Debug] [Interpreter] Execution time : %gms\x1b[0m",
         SUB84((double)(cVar3 - cVar2) / 1000000.0,0));
  unload_all();
  env_free(globalEnv);
  return;
}

Assistant:

void interpret(Code c){
    int i = 0;
    globalEnv = env_new(NULL);
    register_native(globalEnv);
    while(i < c.count){
        executeStatement(c.parts[i], globalEnv);
        i++;
    }
    Call call;
    call.argCount = 0;
    call.identifer = strdup("Main");
    call.arguments = NULL;
    call.line = 0;
    clock_t start = clock();
    resolveCall(call, globalEnv);
    clock_t end = clock();
    printf(debug("[Interpreter] Execution time : %gms"), (double)(end-start)/CLOCKS_PER_SEC);
    unload_all();
    env_free(globalEnv);
}